

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_CutAreaDerefed2(Of_Man_t *p,int *pCut)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int i;
  
  if ((p->vCutRefs).nSize == 0) {
    iVar2 = Of_CutRef2_rec(p,pCut);
    for (i = 0; i < (p->vCutRefs).nSize; i = i + 1) {
      iVar3 = Vec_IntEntry(&p->vCutRefs,i);
      piVar1 = &p->pObjs[iVar3].nRefs;
      *piVar1 = *piVar1 + -1;
    }
    (p->vCutRefs).nSize = 0;
    return iVar2;
  }
  __assert_fail("Vec_IntSize(&p->vCutRefs) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                ,0x440,"int Of_CutAreaDerefed2(Of_Man_t *, int *)");
}

Assistant:

static inline int Of_CutAreaDerefed2( Of_Man_t * p, int * pCut )
{
    int Ela1, i, iObj;
    assert( Vec_IntSize(&p->vCutRefs) == 0 );
    Ela1 = Of_CutRef2_rec( p, pCut );
    Vec_IntForEachEntry( &p->vCutRefs, iObj, i )
        Of_ObjRefDec(p, iObj);
    Vec_IntClear( &p->vCutRefs );
    return Ela1;
}